

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderMaxPatchVertices.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderMaxPatchVertices::initVertexBufferObjects
          (TessellationShaderMaxPatchVertices *this)

{
  GLfloat *pGVar1;
  DataType *pDVar2;
  size_t __size;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  GLfloat *pGVar6;
  GLint *pGVar7;
  TestError *this_00;
  long lVar8;
  long lVar9;
  long lVar5;
  
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  iVar3 = this->m_gl_max_patch_vertices;
  lVar9 = (long)(iVar3 << 2);
  __size = lVar9 * 4;
  pGVar6 = (GLfloat *)malloc(__size);
  this->m_patch_vertices_f = pGVar6;
  if (pGVar6 == (GLfloat *)0x0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Memory allocation failed!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
               ,0x196);
  }
  else {
    pGVar7 = (GLint *)malloc(__size);
    this->m_patch_vertices_i = pGVar7;
    if (pGVar7 != (GLint *)0x0) {
      if (0 < iVar3 << 2) {
        lVar8 = 0;
        do {
          pGVar1 = pGVar6 + lVar8;
          pGVar1[0] = 1.0;
          pGVar1[1] = 2.0;
          pGVar1[2] = 3.0;
          pGVar1[3] = 4.0;
          pDVar2 = (DataType *)(pGVar7 + lVar8);
          pDVar2[0] = TYPE_FLOAT;
          pDVar2[1] = TYPE_FLOAT_VEC2;
          pDVar2[2] = TYPE_FLOAT_VEC3;
          pDVar2[3] = TYPE_FLOAT_VEC4;
          lVar8 = lVar8 + 4;
        } while (lVar8 < lVar9);
      }
      (**(code **)(lVar5 + 0x6c8))(1,&this->m_patch_vertices_bo_f_id);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glGenBuffers() failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x1af);
      (**(code **)(lVar5 + 0x40))(0x8892,this->m_patch_vertices_bo_f_id);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glBindBuffer() failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x1b2);
      (**(code **)(lVar5 + 0x150))
                (0x8892,(long)(this->m_gl_max_patch_vertices << 2) << 2,this->m_patch_vertices_f,
                 0x88e4);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glBufferData() failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x1b6);
      (**(code **)(lVar5 + 0x19f0))(0,4,0x1406,0,0,0);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glVertexAttribPointer(fv) failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x1be);
      (**(code **)(lVar5 + 0x610))(0);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glEnableVertexAttribArray(fv) failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x1c1);
      (**(code **)(lVar5 + 0x40))(0x8892,0);
      (**(code **)(lVar5 + 0x6c8))(1,&this->m_patch_vertices_bo_i_id);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glGenBuffers(ARRAY_BUFFER) failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x1c7);
      (**(code **)(lVar5 + 0x40))(0x8892,this->m_patch_vertices_bo_i_id);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glBindBuffer(ARRAY_BUFFER) failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x1ca);
      (**(code **)(lVar5 + 0x150))
                (0x8892,(long)(this->m_gl_max_patch_vertices << 2) << 2,this->m_patch_vertices_i,
                 0x88e4);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glBufferData(ARRAY_BUFFER) failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x1ce);
      (**(code **)(lVar5 + 0x1958))(1,4,0x1404,0,0);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glVertexAttribPointer(iv) failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x1d4);
      (**(code **)(lVar5 + 0x610))(1);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glEnableVertexAttribArray(iv) failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x1d7);
      (**(code **)(lVar5 + 0x40))(0x8892,0);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glBindBuffer() failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                      ,0x1da);
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Memory allocation failed!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
               ,0x19d);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderMaxPatchVertices::initVertexBufferObjects(void)
{
	/* Retrieve ES entry/state points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Input patch vertices buffer setup. */
	m_patch_vertices_f = (glw::GLfloat*)malloc(m_gl_max_patch_vertices * 4 /* components */ * sizeof(glw::GLfloat));

	if (m_patch_vertices_f == DE_NULL)
	{
		TCU_FAIL("Memory allocation failed!");
	}

	m_patch_vertices_i = (glw::GLint*)malloc(m_gl_max_patch_vertices * 4 /* components */ * sizeof(glw::GLint));

	if (m_patch_vertices_i == DE_NULL)
	{
		TCU_FAIL("Memory allocation failed!");
	}

	for (int i = 0; i < m_gl_max_patch_vertices * 4 /* components */; i += 4 /* components */)
	{
		m_patch_vertices_f[i]	 = 1.0f;
		m_patch_vertices_f[i + 1] = 2.0f;
		m_patch_vertices_f[i + 2] = 3.0f;
		m_patch_vertices_f[i + 3] = 4.0f;

		m_patch_vertices_i[i]	 = 1;
		m_patch_vertices_i[i + 1] = 2;
		m_patch_vertices_i[i + 2] = 3;
		m_patch_vertices_i[i + 3] = 4;
	}

	/* Vec4 vertex attribute array setup. */
	gl.genBuffers(1, &m_patch_vertices_bo_f_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed!");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_patch_vertices_bo_f_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed!");

	gl.bufferData(GL_ARRAY_BUFFER, m_gl_max_patch_vertices * 4 /* components */ * sizeof(glw::GLfloat),
				  m_patch_vertices_f, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed!");

	gl.vertexAttribPointer(0,		 /* index */
						   4,		 /* size */
						   GL_FLOAT, /* type */
						   GL_FALSE, /* normalized */
						   0,		 /* stride */
						   0);		 /* pointer */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribPointer(fv) failed!");

	gl.enableVertexAttribArray(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray(fv) failed!");

	gl.bindBuffer(GL_ARRAY_BUFFER, 0);

	/* Ivec4 vertex attribute array setup. */
	gl.genBuffers(1, &m_patch_vertices_bo_i_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers(ARRAY_BUFFER) failed!");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_patch_vertices_bo_i_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer(ARRAY_BUFFER) failed!");

	gl.bufferData(GL_ARRAY_BUFFER, m_gl_max_patch_vertices * 4 /* components */ * sizeof(glw::GLint),
				  m_patch_vertices_i, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData(ARRAY_BUFFER) failed!");

	gl.vertexAttribIPointer(1,		   /* index */
							4,		   /* size */
							GL_INT, 0, /* stride */
							0);		   /* pointer */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribPointer(iv) failed!");

	gl.enableVertexAttribArray(1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray(iv) failed!");

	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed!");
}